

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

void __thiscall Triangle::_calculateNormal(Triangle *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_30;
  undefined8 local_20;
  value_type local_18;
  
  fVar8 = (this->v0).field_0.field_0.x;
  fVar6 = (this->v1).field_0.field_0.x - fVar8;
  uVar1 = *(undefined8 *)((long)&(this->v1).field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(this->v0).field_0 + 4);
  fVar3 = (float)uVar2;
  fVar4 = (float)uVar1 - fVar3;
  fVar7 = (float)((ulong)uVar2 >> 0x20);
  fVar5 = (float)((ulong)uVar1 >> 0x20) - fVar7;
  fVar3 = (this->v2).field_0.field_0.y - fVar3;
  fVar7 = (this->v2).field_0.field_0.z - fVar7;
  fVar8 = (this->v2).field_0.field_0.x - fVar8;
  local_30.field_0.z = fVar3 * fVar6 - fVar8 * fVar4;
  local_30._0_8_ = CONCAT44(fVar5 * fVar8 - fVar6 * fVar7,fVar4 * fVar7 - fVar5 * fVar3);
  glm::normalize<float>((glm *)&local_20,(tvec3<float> *)&local_30.field_0);
  *(undefined8 *)&(this->n).field_0 = local_20;
  (this->n).field_0.field_0.z = local_18;
  return;
}

Assistant:

void Triangle::_calculateNormal() { 
    n = glm::normalize(glm::cross((v1-v0), (v2-v0)));
    
//     std::cout << "normal: (" << n.x << ", " << n.y << ", " << n.z << ")" << std::endl;
}